

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

int flatcc_builder_custom_reset(flatcc_builder_t *B,int set_defaults,int reduce_buffers)

{
  flatbuffers_voffset_t *pfVar1;
  int iVar2;
  void *__s;
  flatcc_iovec_t *pfVar3;
  long lVar4;
  
  pfVar3 = B->buffers;
  lVar4 = 0;
  do {
    if (lVar4 == 8) {
      B->vb_end = 0;
      if (B->vd_end != 0) {
        B->vd_end = 0x10;
      }
      B->min_align = 0;
      B->emit_start = 0;
      B->emit_end = 0;
      B->ds_offset = 0;
      B->ds_limit = 0;
      B->nest_count = 0;
      B->nest_id = 0;
      B->level = 0;
      B->limit_level = 0;
      pfVar1 = (flatbuffers_voffset_t *)B->buffers[0].iov_base;
      B->ds = (uint8_t *)B->buffers[1].iov_base;
      B->pl = (flatbuffers_voffset_t *)B->buffers[3].iov_base;
      B->vs = pfVar1;
      B->frame = (__flatcc_builder_frame_t *)0x0;
      if (set_defaults != 0) {
        B->vb_flush_limit = 0;
        B->max_level = 0;
        B->disable_vt_clustering = 0;
      }
      if (B->is_default_emitter != 0) {
        flatcc_emitter_reset(&B->default_emit_context);
      }
      if (B->refmap != (flatcc_refmap_t *)0x0) {
        flatcc_refmap_reset(B->refmap);
      }
      return 0;
    }
    __s = pfVar3->iov_base;
    if (__s == (void *)0x0) {
      if (pfVar3->iov_len != 0) {
        __assert_fail("buf->iov_len == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                      ,0x1ba,"int flatcc_builder_custom_reset(flatcc_builder_t *, int, int)");
      }
    }
    else {
      if (lVar4 != 5 && reduce_buffers != 0) {
        iVar2 = (*B->alloc)(B->alloc_context,pfVar3,1,1,(int)lVar4);
        if (iVar2 != 0) {
          return -1;
        }
        __s = pfVar3->iov_base;
      }
      memset(__s,0,pfVar3->iov_len);
    }
    lVar4 = lVar4 + 1;
    pfVar3 = pfVar3 + 1;
  } while( true );
}

Assistant:

int flatcc_builder_custom_reset(flatcc_builder_t *B, int set_defaults, int reduce_buffers)
{
    iovec_t *buf;
    int i;

    for (i = 0; i < FLATCC_BUILDER_ALLOC_BUFFER_COUNT; ++i) {
        buf = B->buffers + i;
        if (buf->iov_base) {
            /* Don't try to reduce the hash table. */
            if (i != flatcc_builder_alloc_ht &&
                reduce_buffers && B->alloc(B->alloc_context, buf, 1, 1, i)) {
                return -1;
            }
            memset(buf->iov_base, 0, buf->iov_len);
        } else {
            FLATCC_ASSERT(buf->iov_len == 0);
        }
    }
    B->vb_end = 0;
    if (B->vd_end > 0) {
        /* Reset past null entry. */
        B->vd_end = sizeof(vtable_descriptor_t);
    }
    B->min_align = 0;
    B->emit_start = 0;
    B->emit_end = 0;
    B->level = 0;
    B->limit_level = 0;
    B->ds_offset = 0;
    B->ds_limit = 0;
    B->nest_count = 0;
    B->nest_id = 0;
    /* Needed for correct offset calculation. */
    B->ds = B->buffers[flatcc_builder_alloc_ds].iov_base;
    B->pl = B->buffers[flatcc_builder_alloc_pl].iov_base;
    B->vs = B->buffers[flatcc_builder_alloc_vs].iov_base;
    B->frame = 0;
    if (set_defaults) {
        B->vb_flush_limit = 0;
        B->max_level = 0;
        B->disable_vt_clustering = 0;
    }
    if (B->is_default_emitter) {
        flatcc_emitter_reset(&B->default_emit_context);
    }
    if (B->refmap) {
        flatcc_refmap_reset(B->refmap);
    }
    return 0;
}